

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O2

UBool __thiscall
icu_63::anon_unknown_4::SortKeyLevel::ensureCapacity(SortKeyLevel *this,int32_t appendCapacity)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  int32_t newCapacity;
  
  if (this->ok != '\0') {
    iVar2 = (this->buffer).capacity * 2;
    iVar1 = this->len + appendCapacity * 2;
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    newCapacity = 200;
    if (200 < iVar2) {
      newCapacity = iVar2;
    }
    puVar3 = MaybeStackArray<unsigned_char,_40>::resize(&this->buffer,newCapacity,this->len);
    if (puVar3 == (uchar *)0x0) {
      this->ok = '\0';
    }
    return puVar3 != (uchar *)0x0;
  }
  return '\0';
}

Assistant:

UBool SortKeyLevel::ensureCapacity(int32_t appendCapacity) {
    if(!ok) {
        return FALSE;
    }
    int32_t newCapacity = 2 * buffer.getCapacity();
    int32_t altCapacity = len + 2 * appendCapacity;
    if (newCapacity < altCapacity) {
        newCapacity = altCapacity;
    }
    if (newCapacity < 200) {
        newCapacity = 200;
    }
    if(buffer.resize(newCapacity, len)==NULL) {
        return ok = FALSE;
    }
    return TRUE;
}